

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O3

void tsgUpdateSequenceGrid
               (void *grid,int depth,char *sType,int *anisotropic_weights,int *limit_levels)

{
  mapped_type *pmVar1;
  size_t sVar2;
  mapped_type type;
  allocator<char> local_89 [9];
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
  local_60;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,sType,local_89);
  TasGrid::IO::getStringToDepthMap_abi_cxx11_();
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
                 *)&local_60,&local_80);
  type = *pmVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (type == type_none) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"WARNING: incorrect depth type: ",0x1f);
    if (sType == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1fb348);
    }
    else {
      sVar2 = strlen(sType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,sType,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,", defaulting to type_iptotal.",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    type = type_iptotal;
  }
  TasGrid::TasmanianSparseGrid::updateSequenceGrid
            ((TasmanianSparseGrid *)grid,depth,type,anisotropic_weights,limit_levels);
  return;
}

Assistant:

void tsgUpdateSequenceGrid(void *grid, int depth, const char * sType, const int *anisotropic_weights, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    ((TasmanianSparseGrid*) grid)->updateSequenceGrid(depth, depth_type, anisotropic_weights, limit_levels);
}